

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O1

sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)

{
  anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0 aVar1;
  sysbvm_tuple_t sVar2;
  undefined8 uVar3;
  sysbvm_object_tuple_t *psVar4;
  
  aVar1 = (anon_union_8_3_721b4b48_for_sysbvm_tuple_header_s_0)(context->roots).globalNamespace;
  sVar2 = (context->roots).defaultAnalysisQueueValueBox;
  if (*(long *)(sVar2 + 0x10) == 0) {
    psVar4 = sysbvm_context_allocatePointerTuple(context,(context->roots).analysisQueueType,2);
    *(sysbvm_object_tuple_t **)(sVar2 + 0x10) = psVar4;
  }
  uVar3 = *(undefined8 *)(sVar2 + 0x10);
  psVar4 = sysbvm_context_allocatePointerTuple(context,(context->roots).environmentType,7);
  psVar4[2].header.field_0 = aVar1;
  psVar4[2].header.identityHashAndFlags = (int)uVar3;
  psVar4[2].header.objectSize = (int)((ulong)uVar3 >> 0x20);
  return (sysbvm_tuple_t)psVar4;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_environment_createDefaultForEvaluation(sysbvm_context_t *context)
{
    return sysbvm_environment_createWithAnalysisQueue(context,
        sysbvm_environment_getIntrinsicsBuiltInEnvironment(context),
        sysbvm_analysisQueue_getDefault(context));
}